

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidFace(ON_Brep *this,int face_index,ON_TextLog *text_log)

{
  ON_BrepFace *this_00;
  uint uVar1;
  ON_BrepFace *pOVar2;
  int *piVar3;
  ON_BrepLoop *pOVar4;
  ON_Surface *pOVar5;
  bool bVar6;
  ulong uVar7;
  ON_Surface *pOVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  byte local_41;
  
  uVar9 = (ulong)(uint)face_index;
  if ((face_index < 0) ||
     ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
      face_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                        uVar9,(ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                           super_ON_ClassArray<ON_BrepFace>.m_count);
    }
    goto LAB_003f0a11;
  }
  pOVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  this_00 = pOVar2 + uVar9;
  if (pOVar2[uVar9].m_face_index == face_index) {
    if (this_00->m_brep == this) {
      uVar7 = (ulong)(this_00->m_li).m_count;
      if (0 < (long)uVar7) {
        uVar11 = 0;
        do {
          piVar3 = (this_00->m_li).m_a;
          uVar1 = piVar3[uVar11];
          if (uVar11 != 0) {
            uVar12 = 0;
            do {
              if (piVar3[uVar12] == uVar1) {
                if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n"
                                  ,uVar11 & 0xffffffff,uVar12 & 0xffffffff,(ulong)uVar1);
                goto LAB_003f0a09;
              }
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          bVar6 = IsValidLoop(this,uVar1,text_log);
          if (!bVar6) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            pcVar10 = "brep.m_L[face.m_li[%d]=%d] is not valid.\n";
            uVar11 = uVar11 & 0xffffffff;
            uVar9 = (ulong)uVar1;
            goto LAB_003f0a02;
          }
          pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                   m_a;
          if (pOVar4[(int)uVar1].m_loop_index == uVar1) {
            if (pOVar4[(int)uVar1].m_fi != face_index) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                                  uVar11 & 0xffffffff,(ulong)uVar1,(ulong)uVar1,
                                  (ulong)(uint)pOVar4[(int)uVar1].m_fi,face_index);
                goto LAB_003f0b5b;
              }
              goto LAB_003f0b63;
            }
            if (uVar11 == 0) {
              bVar6 = true;
              if (pOVar4[(int)uVar1].m_type != outer) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
                  ON_TextLog::PushIndent(text_log);
                  ON_TextLog::Print(text_log,"brep.m_L[face.m_li[0]=%d].m_type is not outer.\n",
                                    (ulong)uVar1);
                  goto LAB_003f0b5b;
                }
                goto LAB_003f0b63;
              }
            }
            else {
              bVar6 = true;
              if ((pOVar4[(int)uVar1].m_type & ~outer) != inner) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
                  ON_TextLog::PushIndent(text_log);
                  pcVar10 = "brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n";
                  goto LAB_003f0b0b;
                }
                goto LAB_003f0b63;
              }
            }
          }
          else {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
              ON_TextLog::PushIndent(text_log);
              pcVar10 = "face.m_li[%d]=%d is a deleted loop\n";
LAB_003f0b0b:
              ON_TextLog::Print(text_log,pcVar10,uVar11 & 0xffffffff,(ulong)uVar1);
LAB_003f0b5b:
              ON_TextLog::PopIndent(text_log);
            }
LAB_003f0b63:
            bVar6 = false;
            local_41 = ON_IsNotValid();
          }
          if (!bVar6) goto LAB_003f0c7e;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar7);
        uVar1 = this_00->m_si;
        if (((long)(int)uVar1 < 0) ||
           ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count <= (int)uVar1)) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
          ON_TextLog::PushIndent(text_log);
          uVar11 = (ulong)(uint)this_00->m_si;
          uVar9 = (ulong)(uint)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
          pcVar10 = "face.m_si=%d (should be >=0 and <%d=m_S.Count())\n";
          goto LAB_003f0a02;
        }
        pOVar5 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[(int)uVar1];
        if (pOVar5 == (ON_Surface *)0x0) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
          ON_TextLog::PushIndent(text_log);
          uVar1 = this_00->m_si;
          pcVar10 = "brep.m_S[face.m_si=%d] is nullptr\n";
        }
        else {
          pOVar8 = ON_SurfaceProxy::ProxySurface(&this_00->super_ON_SurfaceProxy);
          if (pOVar5 == pOVar8) {
            bVar6 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&this_00->super_ON_SurfaceProxy);
            local_41 = 1;
            if (!bVar6) {
LAB_003f0c7e:
              return (bool)(local_41 & 1);
            }
            if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            pcVar10 = "face.ProxySurfaceIsTransposed() is true.\n";
            goto LAB_003f09a5;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
          ON_TextLog::PushIndent(text_log);
          pcVar10 = "brep.m_S[face.m_si=%d] != face.ProxySurface().\n";
        }
        ON_TextLog::Print(text_log,pcVar10,(ulong)uVar1);
        goto LAB_003f0a09;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
      ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
      ON_TextLog::PushIndent(text_log);
      pcVar10 = "face.m_li.Count() <= 0 (should be >= 1)\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
      ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
      ON_TextLog::PushIndent(text_log);
      pcVar10 = "face.m_brep does not point to parent brep.\n";
    }
LAB_003f09a5:
    ON_TextLog::Print(text_log,pcVar10);
  }
  else {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003f0a11;
    ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar9);
    ON_TextLog::PushIndent(text_log);
    uVar11 = (ulong)(uint)this_00->m_face_index;
    pcVar10 = "face.m_face_index = %d (should be %d).\n";
LAB_003f0a02:
    ON_TextLog::Print(text_log,pcVar10,uVar11,uVar9);
  }
LAB_003f0a09:
  ON_TextLog::PopIndent(text_log);
LAB_003f0a11:
  bVar6 = ON_IsNotValid();
  return bVar6;
}

Assistant:

bool
ON_Brep::IsValidFace( int face_index, ON_TextLog* text_log  ) const
{
  if ( face_index < 0 || face_index >= m_F.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                      face_index, m_F.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepFace& face = m_F[face_index];
  if ( face.m_face_index != face_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_face_index = %d (should be %d).\n",
                       face.m_face_index, face_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( face.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int face_loop_count = face.m_li.Count();
  if ( face_loop_count <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_li.Count() <= 0 (should be >= 1)\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  int i, fli, li;
  for ( fli = 0; fli < face_loop_count; fli++ ) 
  {
    li = face.m_li[fli];
    for ( i = 0; i < fli; i++ ) 
    {
      if ( face.m_li[i] == li )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n",
                          fli,i,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    if ( !IsValidLoop( li, text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("brep.m_L[face.m_li[%d]=%d] is not valid.\n",fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepLoop& loop = m_L[li];
    if ( loop.m_loop_index != li )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d is a deleted loop\n",
                        fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( loop.m_fi != face_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                        fli,li,li,loop.m_fi,face_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( fli == 0 ) 
    {
      if ( loop.m_type != ON_BrepLoop::outer )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[0]=%d].m_type is not outer.\n",li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else
    {
      if (   loop.m_type != ON_BrepLoop::slit 
           && loop.m_type != ON_BrepLoop::inner 
         )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n",fli,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
  }

  const int si = face.m_si;
  if ( si < 0 || si >= m_S.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_si=%d (should be >=0 and <%d=m_S.Count())\n",
                      face.m_si,m_S.Count());                      
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !m_S[si] )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] is nullptr\n",face.m_si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( m_S[si] != face.ProxySurface() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] != face.ProxySurface().\n",si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( face.ProxySurfaceIsTransposed() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.ProxySurfaceIsTransposed() is true.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true; 
}